

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

void timer_cb(uv_timer_t *handle)

{
  void *eval_b;
  void *eval_a;
  uv_timer_t *handle_local;
  
  if (handle != &timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-walk-handles.c"
            ,0x2d,"handle","==","&timer",handle,"==",&timer);
    abort();
  }
  uv_walk(timer.loop,walk_cb,magic_cookie);
  uv_close(&timer,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  struct cancel_info* ci;
  uv_req_t* req;
  unsigned i;

  ci = container_of(handle, struct cancel_info, timer_handle);

  for (i = 0; i < ci->nreqs; i++) {
    req = (uv_req_t*) ((char*) ci->reqs + i * ci->stride);
    ASSERT(known_broken(req) || 0 == uv_cancel(req));
  }

  uv_close((uv_handle_t*) &ci->timer_handle, NULL);
  unblock_threadpool();
  timer_cb_called++;
}